

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

void __thiscall FCompileContext::HandleJumps(FCompileContext *this,int token,FxExpression *handler)

{
  FxJumpStatement **ppFVar1;
  FxJumpStatement *pFVar2;
  uint i;
  uint index;
  
  for (index = 0; index < (this->Jumps).Count; index = index + 1) {
    ppFVar1 = (this->Jumps).Array;
    pFVar2 = ppFVar1[index];
    if (*(int *)&(pFVar2->super_FxExpression).field_0x34 == token) {
      pFVar2->AddressResolver = handler;
      TArray<FxJumpStatement_*,_FxJumpStatement_*>::Push(&handler->JumpAddresses,ppFVar1 + index);
      TArray<FxJumpStatement_*,_FxJumpStatement_*>::Delete(&this->Jumps,index);
      index = index - 1;
    }
  }
  return;
}

Assistant:

void FCompileContext::HandleJumps(int token, FxExpression *handler)
{
	for (unsigned int i = 0; i < Jumps.Size(); i++)
	{
		if (Jumps[i]->Token == token)
		{
			Jumps[i]->AddressResolver = handler;
			handler->JumpAddresses.Push(Jumps[i]);
			Jumps.Delete(i);
			i--;
		}
	}
}